

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::ListAggregateFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  idx_t count;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  DataChunk *this_00;
  undefined1 auVar3 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  reference vec;
  BoundFunctionExpression *pBVar6;
  pointer pFVar7;
  pointer pEVar8;
  BoundAggregateExpression *pBVar9;
  idx_t iVar10;
  Vector *pVVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  data_ptr_t pdVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  idx_t child_idx;
  ulong uVar16;
  long *plVar17;
  ArenaAllocator *this_01;
  idx_t count_00;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  Vector slice;
  UnifiedVectorFormat lists_data;
  Vector state_vector_update;
  UnifiedVectorFormat child_data;
  StateVector state_vector;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2a8;
  Vector *local_2a0;
  void *local_298;
  Vector *local_290;
  DataChunk *local_288;
  buffer_ptr<ValidityBuffer> *local_280;
  data_ptr_t local_278;
  idx_t local_270;
  data_ptr_t local_268;
  AggregateFunction *local_260;
  SelectionVector local_258;
  AggregateInputData local_240;
  idx_t local_228;
  LogicalType local_220;
  undefined1 local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_200 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  UnifiedVectorFormat local_1a0;
  Vector local_158;
  UnifiedVectorFormat local_f0;
  StateVector local_a8;
  
  count = args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(result);
  if ((vec->type).id_ != SQLNULL) {
    local_288 = args;
    pBVar6 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                       (&state->expr->super_BaseExpression);
    pFVar7 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&pBVar6->bind_info);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar7 + 4));
    pBVar9 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar8->super_BaseExpression);
    local_a8.count = (idx_t)state[1]._vptr_ExpressionState;
    optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
              ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_a8);
    this_01 = (ArenaAllocator *)(local_a8.count + 8);
    ArenaAllocator::Reset(this_01);
    local_240.bind_data.ptr =
         (pBVar9->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    local_240.combine_type = PRESERVE_INPUT;
    local_240.allocator = this_01;
    iVar10 = ListVector::GetListSize(vec);
    pVVar11 = ListVector::GetEntry(vec);
    Vector::Flatten(pVVar11,iVar10);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f0);
    local_290 = pVVar11;
    Vector::ToUnifiedFormat(pVVar11,iVar10,&local_f0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_1a0);
    Vector::ToUnifiedFormat(vec,count,&local_1a0);
    local_278 = local_1a0.data;
    local_260 = &pBVar9->function;
    iVar10 = (*(pBVar9->function).state_size)(local_260);
    local_298 = operator_new__(iVar10 * count);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar7 + 4));
    (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_2a8,pEVar8);
    StateVector::StateVector
              (&local_a8,count,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_2a8);
    if (local_2a8._M_head_impl != (Expression *)0x0) {
      (*((local_2a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_2a8._M_head_impl = (Expression *)0x0;
    local_268 = local_a8.state_vector.data;
    LogicalType::LogicalType(&local_220,POINTER);
    Vector::Vector(&local_158,&local_220,0x800);
    LogicalType::~LogicalType(&local_220);
    SelectionVector::SelectionVector(&local_258,0x800);
    local_2a0 = result;
    if (count == 0) {
      count_00 = 0;
    }
    else {
      local_280 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      count_00 = 0;
      uVar15 = 0;
      local_270 = iVar10;
      do {
        pdVar14 = (data_ptr_t)(uVar15 * local_270 + (long)local_298);
        *(data_ptr_t *)(local_268 + uVar15 * 8) = pdVar14;
        (*(pBVar9->function).initialize)(local_260,pdVar14);
        pVVar11 = local_2a0;
        uVar16 = uVar15;
        if ((local_1a0.sel)->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)(local_1a0.sel)->sel_vector[uVar15];
        }
        if ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)) {
          plVar17 = (long *)(local_278 + uVar16 * 0x10);
          if (plVar17[1] != 0) {
            uVar16 = 0;
            do {
              if (count_00 == 0x800) {
                Vector::Vector((Vector *)local_208,local_290,&local_258,0x800);
                (*(pBVar9->function).update)((Vector *)local_208,&local_240,1,&local_158,0x800);
                if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
                }
                if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
                }
                if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
                }
                LogicalType::~LogicalType((LogicalType *)ap_Stack_200);
                count_00 = 0;
              }
              uVar12 = *plVar17 + uVar16;
              if ((local_f0.sel)->sel_vector != (sel_t *)0x0) {
                uVar12 = (ulong)(local_f0.sel)->sel_vector[uVar12];
              }
              local_258.sel_vector[count_00] = (sel_t)uVar12;
              *(data_ptr_t *)(local_158.data + count_00 * 8) = pdVar14;
              count_00 = count_00 + 1;
              uVar16 = uVar16 + 1;
            } while (uVar16 < (ulong)plVar17[1]);
          }
        }
        else {
          if ((local_2a0->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_228 = (local_2a0->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_208,&local_228);
            p_Var4 = ap_Stack_200[0];
            auVar3 = local_208;
            local_208 = (undefined1  [8])0x0;
            ap_Stack_200[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)auVar3;
            (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var4;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (ap_Stack_200[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_200[0]);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_280);
            (local_2a0->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar2 = (byte)uVar15 & 0x3f;
          puVar1 = (local_2a0->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar15 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != count);
    }
    this_00 = local_288;
    pVVar11 = local_2a0;
    if (count_00 != 0) {
      Vector::Vector((Vector *)local_208,local_290,&local_258,count_00);
      (*(pBVar9->function).update)((Vector *)local_208,&local_240,1,&local_158,count_00);
      if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
      }
      if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
      }
      if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)ap_Stack_200);
    }
    (*(pBVar9->function).finalize)(&local_a8.state_vector,&local_240,pVVar11,count,0);
    bVar5 = DataChunk::AllConstant(this_00);
    if (bVar5) {
      Vector::SetVectorType(pVVar11,CONSTANT_VECTOR);
    }
    if (local_258.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_158.type);
    StateVector::~StateVector(&local_a8);
    operator_delete__(local_298);
    if (local_1a0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_f0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return;
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ListAggregateFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 2);
	ListAggregatesFunction<AggregateFunctor, true>(args, state, result);
}